

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O0

void * readsf_new(t_floatarg fnchannels,t_floatarg fbufsize)

{
  _binbuf *p_Var1;
  t_symbol *s;
  _outlet *p_Var2;
  _clock *p_Var3;
  _glist *p_Var4;
  char *buf;
  int local_28;
  int i;
  int bufsize;
  int nchannels;
  t_readsf *x;
  t_floatarg fbufsize_local;
  t_floatarg fnchannels_local;
  
  i = (int)fnchannels;
  local_28 = (int)fbufsize;
  if (i < 1) {
    i = 1;
  }
  else if (0x40 < i) {
    i = 0x40;
  }
  if (local_28 < 1) {
    local_28 = i << 0x12;
  }
  else if (local_28 < 0x40000) {
    local_28 = 0x40000;
  }
  else if (0x1000000 < local_28) {
    local_28 = 0x1000000;
  }
  p_Var1 = (_binbuf *)getbytes((long)local_28);
  if (p_Var1 == (_binbuf *)0x0) {
    _fbufsize_local = (t_object *)0x0;
  }
  else {
    _fbufsize_local = (t_object *)pd_new(readsf_class);
    for (buf._4_4_ = 0; buf._4_4_ < i; buf._4_4_ = buf._4_4_ + 1) {
      s = gensym("signal");
      outlet_new(_fbufsize_local,s);
    }
    *(int *)((long)&_fbufsize_local[1].te_outlet + 4) = i;
    p_Var2 = outlet_new(_fbufsize_local,&s_bang);
    _fbufsize_local[0xc].te_outlet = p_Var2;
    pthread_mutex_init((pthread_mutex_t *)&_fbufsize_local[0xf].te_outlet,(pthread_mutexattr_t *)0x0
                      );
    pthread_cond_init((pthread_cond_t *)&_fbufsize_local[0x10].te_binbuf,(pthread_condattr_t *)0x0);
    pthread_cond_init((pthread_cond_t *)&_fbufsize_local[0x11].te_binbuf,(pthread_condattr_t *)0x0);
    *(undefined4 *)&_fbufsize_local[0xc].te_binbuf = 0x80;
    *(undefined4 *)&_fbufsize_local[0xc].te_inlet = 0;
    p_Var3 = clock_new(_fbufsize_local,readsf_tick);
    _fbufsize_local[1].te_g.g_next = (_gobj *)p_Var3;
    p_Var4 = canvas_getcurrent();
    _fbufsize_local[1].te_g.g_pd = (t_pd)p_Var4;
    soundfile_clear((t_soundfile *)&_fbufsize_local[0xd].te_binbuf);
    _fbufsize_local[0xd].te_xpix = 2;
    _fbufsize_local[0xd].te_ypix = 0;
    *(undefined4 *)((long)&_fbufsize_local[0xd].te_inlet + 4) = 1;
    *(undefined4 *)((long)&_fbufsize_local[0xe].te_g.g_next + 4) = 2;
    _fbufsize_local[1].te_binbuf = p_Var1;
    *(int *)&_fbufsize_local[1].te_outlet = local_28;
    _fbufsize_local[0xc].te_xpix = 0;
    _fbufsize_local[0xc].te_ypix = 0;
    _fbufsize_local[0xe].te_xpix = 0;
    _fbufsize_local[0xe].te_ypix = 0;
    *(undefined4 *)((long)&_fbufsize_local[0xe].te_inlet + 4) = 0;
    *(undefined4 *)&_fbufsize_local[0xe].te_inlet = 0;
    pthread_create((pthread_t *)&_fbufsize_local[0x12].te_binbuf,(pthread_attr_t *)0x0,
                   readsf_child_main,_fbufsize_local);
  }
  return _fbufsize_local;
}

Assistant:

static void *readsf_new(t_floatarg fnchannels, t_floatarg fbufsize)
{
    t_readsf *x;
    int nchannels = fnchannels, bufsize = fbufsize, i;
    char *buf;

    if (nchannels < 1)
        nchannels = 1;
    else if (nchannels > MAXSFCHANS)
        nchannels = MAXSFCHANS;
    if (bufsize <= 0) bufsize = DEFBUFPERCHAN * nchannels;
    else if (bufsize < MINBUFSIZE)
        bufsize = MINBUFSIZE;
    else if (bufsize > MAXBUFSIZE)
        bufsize = MAXBUFSIZE;
    buf = getbytes(bufsize);
    if (!buf) return 0;

    x = (t_readsf *)pd_new(readsf_class);

    for (i = 0; i < nchannels; i++)
        outlet_new(&x->x_obj, gensym("signal"));
    x->x_noutlets = nchannels;
    x->x_bangout = outlet_new(&x->x_obj, &s_bang);
    pthread_mutex_init(&x->x_mutex, 0);
    pthread_cond_init(&x->x_requestcondition, 0);
    pthread_cond_init(&x->x_answercondition, 0);
    x->x_vecsize = MAXVECSIZE;
    x->x_state = STATE_IDLE;
    x->x_clock = clock_new(x, (t_method)readsf_tick);
    x->x_canvas = canvas_getcurrent();
    soundfile_clear(&x->x_sf);
    x->x_sf.sf_bytespersample = 2;
    x->x_sf.sf_nchannels = 1;
    x->x_sf.sf_bytesperframe = 2;
    x->x_buf = buf;
    x->x_bufsize = bufsize;
    x->x_fifosize = x->x_fifohead = x->x_fifotail = x->x_requestcode = 0;
#ifdef PDINSTANCE
    x->x_pd_this = pd_this;
#endif
    pthread_create(&x->x_childthread, 0, readsf_child_main, x);
    return x;
}